

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage.cpp
# Opt level: O3

void __thiscall
pstore::storage::map_bytes(storage *this,uint64_t old_logical_size,uint64_t new_logical_size)

{
  pointer psVar1;
  pointer psVar2;
  element_type *peVar3;
  factory *pfVar4;
  ulong uVar5;
  not_null<std::vector<std::shared_ptr<pstore::memory_mapper_base>,_std::allocator<std::shared_ptr<pstore::memory_mapper_base>_>_>_*>
  local_38;
  
  psVar1 = (this->regions_).
           super__Vector_base<std::shared_ptr<pstore::memory_mapper_base>,_std::allocator<std::shared_ptr<pstore::memory_mapper_base>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar2 = (this->regions_).
           super__Vector_base<std::shared_ptr<pstore::memory_mapper_base>,_std::allocator<std::shared_ptr<pstore::memory_mapper_base>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (psVar1 == psVar2) {
    uVar5 = 0;
  }
  else {
    peVar3 = psVar2[-1].super___shared_ptr<pstore::memory_mapper_base,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    uVar5 = peVar3->size_ + peVar3->offset_;
  }
  if (uVar5 < new_logical_size) {
    local_38.ptr_ = &this->regions_;
    pfVar4 = (this->region_factory_)._M_t.
             super___uniq_ptr_impl<pstore::region::factory,_std::default_delete<pstore::region::factory>_>
             ._M_t.
             super__Tuple_impl<0UL,_pstore::region::factory_*,_std::default_delete<pstore::region::factory>_>
             .super__Head_base<0UL,_pstore::region::factory_*,_false>._M_head_impl;
    gsl::
    not_null<std::vector<std::shared_ptr<pstore::memory_mapper_base>,_std::allocator<std::shared_ptr<pstore::memory_mapper_base>_>_>_*>
    ::ensure_invariant(&local_38);
    (*pfVar4->_vptr_factory[3])(pfVar4,local_38.ptr_,uVar5,new_logical_size);
    update_master_pointers(this,(long)psVar2 - (long)psVar1 >> 4);
  }
  else if (new_logical_size < old_logical_size) {
    shrink(this,new_logical_size);
    return;
  }
  return;
}

Assistant:

void storage::map_bytes (std::uint64_t const old_logical_size,
                             std::uint64_t const new_logical_size) {
        // Get the file offset of the end of the last memory mapped region.
        std::uint64_t const old_physical_size =
            regions_.empty () ? std::uint64_t{0} : regions_.back ()->end ();
        if (new_logical_size > old_physical_size) {
            // if growing the storage
            auto const old_num_regions = regions_.size ();
            // Allocate new memory region(s) to accommodate the additional bytes requested.
            region_factory_->add (&regions_, old_physical_size, new_logical_size);
            this->update_master_pointers (old_num_regions);
            return;
        }
        if (new_logical_size < old_logical_size) {
            // if shrinking the storage
            this->shrink (new_logical_size);
        }
    }